

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::exceptionsCatchAfter(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  
  this_00 = &this->catchStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  this->exceptionHandler = uVar1;
  ForthStack<unsigned_int>::pop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  ForthStack<unsigned_int>::push(&this->dStack,0);
  return;
}

Assistant:

void exceptionsCatchAfter(){
			exceptionHandler = catchStack.getTop(); catchStack.pop();
			catchStack.pop();
			catchStack.pop();
			catchStack.pop();
			catchStack.pop();
			dStack.push(0);
		}